

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppmlnn.cpp
# Opt level: O2

MatrixXd * __thiscall CppMLNN::softmax(MatrixXd *__return_storage_ptr__,CppMLNN *this,MatrixXd *z)

{
  VectorXd sum_exp_z;
  VectorXd v_max;
  MatrixXd exp_z;
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *local_88 [2];
  void *local_78 [2];
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,__1,_1>_>
  local_68;
  MatrixXd *local_40 [3];
  undefined1 *local_28;
  PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *local_20;
  
  local_68.m_lhs.m_expression = z;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::PartialReduxExpr<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::member_maxCoeff<double>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_78,
             (DenseBase<Eigen::PartialReduxExpr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_maxCoeff<double>,_0>_>
              *)&local_68);
  local_88[0] = (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_78;
  local_40[0] = z;
  Eigen::VectorwiseOp<Eigen::Matrix<double,-1,-1,0,-1,-1>,1>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,__1,_1>_>
              *)&local_68,(VectorwiseOp<Eigen::Matrix<double,_1,_1,0,_1,_1>,1> *)local_40,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)local_88);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,_1,1>const>>
            (z,(CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,__1,_1>_>
                *)&local_68);
  local_68.m_lhs.m_expression = z;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_40,
             (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)&local_68);
  local_68.m_lhs.m_expression = (NestedExpressionType)local_40;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::PartialReduxExpr<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::member_sum<double>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_88,
             (DenseBase<Eigen::PartialReduxExpr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double>,_0>_>
              *)&local_68);
  local_28 = (undefined1 *)local_88;
  local_20 = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_40;
  Eigen::VectorwiseOp<Eigen::ArrayWrapper<Eigen::Matrix<double,-1,-1,0,-1,-1>>,1>::operator/
            (&local_68,
             (VectorwiseOp<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>>,1> *)&local_20,
             (DenseBase<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)&local_28);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>>const,Eigen::Replicate<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>>,_1,1>const>>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,&local_68);
  free(local_88[0]);
  free(local_40[0]);
  free(local_78[0]);
  return __return_storage_ptr__;
}

Assistant:

MatrixXd CppMLNN::softmax(MatrixXd z) {
	// minus max value of each output vector to avoid NaN
	// this is actually making softmax values to normalize between [0, 1]
	// and will not affect the results of softmax.
	VectorXd v_max = z.colwise().maxCoeff();
	z = z.rowwise() - v_max.transpose();

	MatrixXd exp_z = z.array().exp();
	VectorXd sum_exp_z = exp_z.colwise().sum();
	return static_cast<MatrixXd>(exp_z.array().rowwise() / sum_exp_z.transpose().array());
}